

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yin_print_when(lyout *out,int level,lys_module *module,lys_when *when)

{
  int level_00;
  uint in_EAX;
  char *text;
  undefined8 uStack_38;
  int flag;
  
  uStack_38 = (ulong)in_EAX;
  text = transform_json2schema(module,when->cond);
  if (text != (char *)0x0) {
    ly_print(out,"%*s<when condition=\"",(ulong)(uint)(level * 2));
    lyxml_dump_text(out,text,LYXML_DATA_ATTR);
    ly_print(out,"\"");
    lydict_remove(module->ctx,text);
    level_00 = level + 1;
    if (when->ext_size != '\0') {
      yin_print_close_parent(out,(int *)((long)&uStack_38 + 4));
      yin_print_extension_instances
                (out,level_00,module,LYEXT_SUBSTMT_SELF,'\0',when->ext,(uint)when->ext_size);
    }
    if (when->dsc != (char *)0x0) {
      yin_print_close_parent(out,(int *)((long)&uStack_38 + 4));
      yin_print_substmt(out,level_00,LYEXT_SUBSTMT_DESCRIPTION,'\0',when->dsc,module,when->ext,
                        (uint)when->ext_size);
    }
    if (when->ref != (char *)0x0) {
      yin_print_close_parent(out,(int *)((long)&uStack_38 + 4));
      yin_print_substmt(out,level_00,LYEXT_SUBSTMT_REFERENCE,'\0',when->ref,module,when->ext,
                        (uint)when->ext_size);
    }
    yin_print_close(out,level,(char *)0x0,"when",uStack_38._4_4_);
    return;
  }
  ly_print(out,"(!error!)");
  return;
}

Assistant:

static void
yin_print_when(struct lyout *out, int level, const struct lys_module *module, const struct lys_when *when)
{
    int flag = 0;
    const char *str;

    str = transform_json2schema(module, when->cond);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }

    ly_print(out, "%*s<when condition=\"", LEVEL, INDENT);
    lyxml_dump_text(out, str, LYXML_DATA_ATTR);
    ly_print(out, "\"");
    lydict_remove(module->ctx, str);

    level++;

    if (when->ext_size) {
        /* extension is stored in lys_when incompatible with lys_node, so we cannot use yang_print_snode_common() */
        yin_print_close_parent(out, &flag);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, when->ext, when->ext_size);
    }
    if (when->dsc != NULL) {
        yin_print_close_parent(out, &flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, when->dsc,
                          module, when->ext, when->ext_size);
    }
    if (when->ref != NULL) {
        yin_print_close_parent(out, &flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, when->ref,
                          module, when->ext, when->ext_size);
    }

    level--;
    yin_print_close(out, level, NULL, "when", flag);
}